

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<std::tuple<int,_aom_rc_mode,_int>_> __thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder *this)

{
  CartesianProductGenerator<int,_aom_rc_mode,_int> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Tuple_impl<0UL,_testing::internal::ValueArray<unsigned_int>,_testing::internal::ValueArray<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
  *in_RSI;
  ParamGenerator<std::tuple<int,_aom_rc_mode,_int>_> PVar1;
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
  local_50;
  
  this_00 = (CartesianProductGenerator<int,_aom_rc_mode,_int> *)operator_new(0x38);
  std::
  _Tuple_impl<0ul,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<aom_rc_mode>,testing::internal::ParamGenerator<int>>
  ::
  _Tuple_impl<testing::internal::ValueArray<unsigned_int>,testing::internal::ValueArray<aom_rc_mode>,testing::internal::ParamGenerator<int>>
            ((_Tuple_impl<0ul,testing::internal::ParamGenerator<int>,testing::internal::ParamGenerator<aom_rc_mode>,testing::internal::ParamGenerator<int>>
              *)&local_50,in_RSI);
  CartesianProductGenerator<int,_aom_rc_mode,_int>::CartesianProductGenerator
            (this_00,(tuple<testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
                      *)&local_50);
  std::
  __shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<int,aom_rc_mode,int>>const,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<int,aom_rc_mode,int>>,void>
            ((__shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<int,aom_rc_mode,int>>const,(__gnu_cxx::_Lock_policy)2>
              *)this,(ParamGeneratorInterface<std::tuple<int,_aom_rc_mode,_int>_> *)this_00);
  std::
  _Tuple_impl<0UL,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<aom_rc_mode>,_testing::internal::ParamGenerator<int>_>
  ::~_Tuple_impl(&local_50);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_aom_rc_mode,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_aom_rc_mode,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<int,_aom_rc_mode,_int>_>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_aom_rc_mode,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }